

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyLB.hpp
# Opt level: O3

void njoy::ENDFtk::section::CovariancePairs::verifyLB(int LB,int LT)

{
  undefined8 *puVar1;
  char *pcVar2;
  
  if ((uint)LB < 10) {
    if ((0x307U >> (LB & 0x1fU) & 1) == 0) {
      if ((0x18U >> (LB & 0x1fU) & 1) == 0) goto LAB_00138f4e;
      if (0 < LT) {
        return;
      }
      tools::Log::error<char_const*>("Encountered illegal LT value");
      pcVar2 = "LT must be positive for LB=3,4";
    }
    else {
      if (LT == 0) {
        return;
      }
      tools::Log::error<char_const*>("Encountered illegal LT value");
      pcVar2 = "LT must be equal to 0 for LB=0,1,2,8,9";
    }
    tools::Log::info<char_const*>(pcVar2);
    pcVar2 = "LT value: {}";
  }
  else {
LAB_00138f4e:
    tools::Log::error<char_const*>("Encountered illegal LB value");
    tools::Log::info<char_const*>("LB must be 0,1,2,3,4,8,9 for CovariancePairs");
    pcVar2 = "LB value: {}";
    LT = LB;
  }
  tools::Log::info<char_const*,int>(pcVar2,LT);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifyLB( int LB, int LT ) {

  switch( LB ) {

    case 0:
    case 1:
    case 2:
    case 8:
    case 9:
      if ( LT != 0 ) {
        Log::error( "Encountered illegal LT value" );
        Log::info( "LT must be equal to 0 for LB=0,1,2,8,9" );
        Log::info( "LT value: {}", LT );
        throw std::exception();
      }
      break;

    case 3:
    case 4:
      if ( LT <= 0 ) {
        Log::error( "Encountered illegal LT value" );
        Log::info( "LT must be positive for LB=3,4" );
        Log::info( "LT value: {}", LT );
        throw std::exception();
      }
      break;

    default:
      Log::error( "Encountered illegal LB value" );
      Log::info( "LB must be 0,1,2,3,4,8,9 for CovariancePairs" );
      Log::info( "LB value: {}", LB );
      throw std::exception();

  }

}